

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sidebar.c
# Opt level: O2

nh_bool curses_list_items_core
                  (nh_objitem_conflict *items,wchar_t icount,nh_bool invent,nh_bool draw)

{
  nh_objitem_conflict *__dest;
  wchar_t *pwVar1;
  nh_objitem_conflict **ppnVar2;
  
  pwVar1 = &inv_icount;
  if (invent == '\0') {
    pwVar1 = &floor_icount;
  }
  ppnVar2 = &inventory;
  if (invent == '\0') {
    ppnVar2 = &flooritems;
  }
  *pwVar1 = icount;
  free(*ppnVar2);
  if (icount == L'\0') {
    *ppnVar2 = (nh_objitem_conflict *)0x0;
  }
  else {
    __dest = (nh_objitem_conflict *)malloc((long)icount * 0x124);
    *ppnVar2 = __dest;
    memcpy(__dest,items,(long)icount * 0x124);
  }
  if (draw != '\0') {
    draw_sidebar();
  }
  return ui_flags.draw_sidebar;
}

Assistant:

static nh_bool curses_list_items_core(struct nh_objitem *items, int icount,
			              nh_bool invent, nh_bool draw)
{
    struct nh_objitem **list;
    if (invent) {
	inv_icount = icount;
	list = &inventory;
    } else {
	floor_icount = icount;
	list = &flooritems;
    }
    
    free(*list);
    if (!icount)
	*list = NULL;
    else {
	*list = malloc(icount * sizeof(struct nh_objitem));
	memcpy(*list, items, icount * sizeof(struct nh_objitem));
    }
    
    if (draw)
	draw_sidebar();
    
    return ui_flags.draw_sidebar;
}